

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

size_t ll_free(ll_node *node)

{
  ll_node *plVar1;
  size_t sVar2;
  
  if (node == (ll_node *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      plVar1 = node->next;
      free(node->value_ptr);
      free(node);
      sVar2 = sVar2 + 1;
      node = plVar1;
    } while (plVar1 != (ll_node *)0x0);
  }
  return sVar2;
}

Assistant:

size_t ll_free(struct ll_node *node)
{
	struct ll_node *cur_node = node;
	struct ll_node *next_node = NULL;
	size_t count = 0;
	if (node == NULL) {
		return 0;
	}
	do {
		next_node = cur_node->next;
		ll_free_node(cur_node);
		cur_node = next_node;
		count++;
	} while (cur_node != NULL);
	return count;
}